

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS
ref_collapse_edge_normdev(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE pRVar1;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  REF_GRID pRVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  REF_STATUS RVar8;
  long lVar9;
  undefined8 uVar10;
  ulong uVar11;
  REF_INT RVar12;
  REF_BOOL supported;
  REF_BOOL node0_support;
  REF_BOOL node1_support;
  REF_DBL new_uv_area;
  REF_DBL orig_uv_area;
  REF_DBL sign_uv_area;
  REF_DBL new_dev;
  REF_DBL orig_dev;
  REF_INT nodes [27];
  REF_INT new_nodes [27];
  int local_184;
  REF_BOOL *local_180;
  REF_GEOM local_178;
  int local_16c;
  REF_CELL local_168;
  ulong local_160;
  REF_GRID local_158;
  int local_150;
  int local_14c;
  REF_NODE local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  REF_INT local_118 [28];
  REF_INT local_a8 [30];
  
  pRVar1 = ref_grid->node;
  ref_geom = ref_grid->geom;
  local_180 = allowed;
  uVar6 = ref_geom_supported(ref_geom,node0,&local_16c);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           0x3ac,"ref_collapse_edge_normdev",(ulong)uVar6,"support0");
    return uVar6;
  }
  local_178 = ref_geom;
  local_150 = node0;
  local_148 = pRVar1;
  uVar6 = ref_geom_supported(ref_geom,node1,&local_14c);
  iVar5 = local_150;
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           0x3ad,"ref_collapse_edge_normdev",(ulong)uVar6,"support1");
    return uVar6;
  }
  if ((((local_178->model != (void *)0x0) || (local_178->meshlink != (void *)0x0)) &&
      (local_16c != 0)) && (local_14c != 0)) {
    *local_180 = 0;
    ref_cell = ref_grid->cell[3];
    RVar12 = -1;
    uVar11 = 0xffffffff;
    if (-1 < node1) {
      uVar11 = 0xffffffff;
      if (node1 < ref_cell->ref_adj->nnode) {
        uVar11 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node1];
      }
    }
    local_158 = ref_grid;
    if ((int)uVar11 != -1) {
      RVar12 = ref_cell->ref_adj->item[(int)uVar11].ref;
    }
    while (pRVar4 = local_158, (int)uVar11 != -1) {
      uVar6 = ref_cell_nodes(ref_cell,RVar12,local_118);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x3b8,"ref_collapse_edge_normdev",(ulong)uVar6,"nodes");
        return uVar6;
      }
      uVar6 = ref_geom_tri_supported(local_178,local_118,&local_184);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x3ba,"ref_collapse_edge_normdev",(ulong)uVar6,"tri support");
        return uVar6;
      }
      if (local_184 != 0) {
        if (0 < (long)ref_cell->node_per) {
          lVar9 = 0;
          bVar3 = false;
          do {
            if (local_118[lVar9] == iVar5) {
              bVar3 = true;
            }
            lVar9 = lVar9 + 1;
          } while (ref_cell->node_per != lVar9);
          if (bVar3) goto LAB_001d873a;
        }
        iVar7 = ref_cell->node_per;
        if (0 < iVar7) {
          lVar9 = 0;
          do {
            iVar7 = local_118[lVar9];
            if (local_118[lVar9] == node1) {
              iVar7 = iVar5;
            }
            local_a8[lVar9] = iVar7;
            lVar9 = lVar9 + 1;
            iVar7 = ref_cell->node_per;
          } while (lVar9 < iVar7);
        }
        local_a8[iVar7] = local_118[iVar7];
        uVar6 = ref_geom_cell_tuv_supported(local_178,local_118,2,&local_184);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x3cc,"ref_collapse_edge_normdev",(ulong)uVar6,
                 "tuv support for original configuration");
          return uVar6;
        }
        if (local_184 == 0) {
          uVar10 = 0x3ce;
          goto LAB_001d8b11;
        }
        uVar6 = ref_geom_tri_norm_deviation(local_158,local_118,&local_120);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x3cf,"ref_collapse_edge_normdev",(ulong)uVar6,"orig");
          return uVar6;
        }
        uVar6 = ref_geom_cell_tuv_supported(local_178,local_a8,2,&local_184);
        pRVar4 = local_158;
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x3d2,"ref_collapse_edge_normdev",(ulong)uVar6,
                 "tuv support for swapped configuration");
          return uVar6;
        }
        if (((local_184 == 0) ||
            (RVar8 = ref_geom_tri_norm_deviation(local_158,local_a8,&local_128), RVar8 != 0)) ||
           ((local_128 < pRVar4->adapt->post_min_normdev && (local_128 < local_120))))
        goto LAB_001d8abd;
      }
LAB_001d873a:
      pRVar2 = ref_cell->ref_adj->item;
      uVar11 = (ulong)pRVar2[(int)uVar11].next;
      if (uVar11 == 0xffffffffffffffff) {
        RVar12 = -1;
      }
      else {
        RVar12 = pRVar2[uVar11].ref;
      }
    }
    if (local_158->geom->meshlink == (void *)0x0) {
      local_168 = local_158->cell[3];
      local_160 = 0xffffffff;
      if (-1 < node1) {
        local_160 = 0xffffffff;
        if (node1 < local_168->ref_adj->nnode) {
          local_160 = (ulong)(uint)local_168->ref_adj->first[(uint)node1];
        }
      }
      if ((int)local_160 != -1) {
        RVar12 = local_168->ref_adj->item[(int)local_160].ref;
        do {
          uVar6 = ref_cell_nodes(local_168,RVar12,local_118);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x3ec,"ref_collapse_edge_normdev",(ulong)uVar6,"nodes");
            return uVar6;
          }
          if ((long)local_168->node_per < 1) {
LAB_001d8850:
            iVar7 = local_168->node_per;
            if (0 < iVar7) {
              lVar9 = 0;
              do {
                iVar7 = local_118[lVar9];
                if (local_118[lVar9] == node1) {
                  iVar7 = iVar5;
                }
                local_a8[lVar9] = iVar7;
                lVar9 = lVar9 + 1;
                iVar7 = local_168->node_per;
              } while (lVar9 < iVar7);
            }
            local_a8[iVar7] = local_118[iVar7];
            uVar6 = ref_geom_cell_tuv_supported(local_178,local_118,2,&local_184);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,0x3fe,"ref_collapse_edge_normdev",(ulong)uVar6,
                     "tuv support for original configuration");
              return uVar6;
            }
            if (local_184 == 0) {
              uVar10 = 0x400;
LAB_001d8b11:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,uVar10,"ref_collapse_edge_normdev",
                     "original configuration before collapse does not support cell tuv");
              return 1;
            }
            uVar6 = ref_geom_cell_tuv_supported(local_178,local_a8,2,&local_184);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,0x403,"ref_collapse_edge_normdev",(ulong)uVar6,
                     "tuv support for swapped configuration");
              return uVar6;
            }
            if (local_184 == 0) {
LAB_001d8abd:
              *local_180 = 0;
              return 0;
            }
            uVar6 = ref_geom_uv_area_sign(pRVar4,local_118[local_168->node_per],&local_130);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,0x40a,"ref_collapse_edge_normdev",(ulong)uVar6,"sign");
              return uVar6;
            }
            uVar6 = ref_geom_uv_area(local_178,local_118,&local_138);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,0x40b,"ref_collapse_edge_normdev",(ulong)uVar6,"uv area");
              return uVar6;
            }
            uVar6 = ref_geom_uv_area(local_178,local_a8,&local_140);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                     ,0x40c,"ref_collapse_edge_normdev",(ulong)uVar6,"uv area");
              return uVar6;
            }
            if (local_148->min_uv_area < local_140 * local_130) goto LAB_001d8a72;
            iVar7 = (int)local_160;
            if (local_140 * local_130 < local_130 * local_138) goto LAB_001d8abd;
          }
          else {
            lVar9 = 0;
            bVar3 = false;
            do {
              if (local_118[lVar9] == iVar5) {
                bVar3 = true;
              }
              lVar9 = lVar9 + 1;
            } while (local_168->node_per != lVar9);
            if (!bVar3) goto LAB_001d8850;
LAB_001d8a72:
            iVar7 = (int)local_160;
          }
          pRVar2 = local_168->ref_adj->item;
          iVar7 = pRVar2[iVar7].next;
          local_160 = (ulong)iVar7;
          if (local_160 == 0xffffffffffffffff) {
            RVar12 = -1;
          }
          else {
            RVar12 = pRVar2[local_160].ref;
          }
        } while (iVar7 != -1);
      }
    }
  }
  *local_180 = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_normdev(REF_GRID ref_grid, REF_INT node0,
                                             REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell;
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed;

  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_BOOL node0_support, node1_support, supported;
  REF_DBL orig_dev, new_dev;
  REF_DBL sign_uv_area, orig_uv_area, new_uv_area;

  RSS(ref_geom_supported(ref_geom, node0, &node0_support), "support0");
  RSS(ref_geom_supported(ref_geom, node1, &node1_support), "support1");
  if (!(ref_geom_model_loaded(ref_geom) || ref_geom_meshlinked(ref_geom)) ||
      !node0_support || !node1_support) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
    if (!supported) continue; /* no geom support, check by same normal */

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      new_nodes[node] = nodes[node];
      if (node1 == new_nodes[node]) new_nodes[node] = node0;
    }
    new_nodes[ref_cell_node_per(ref_cell)] = nodes[ref_cell_node_per(ref_cell)];

    RSS(ref_geom_cell_tuv_supported(ref_geom, nodes, REF_GEOM_FACE, &supported),
        "tuv support for original configuration");
    RAS(supported,
        "original configuration before collapse does not support cell tuv");
    RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &orig_dev), "orig");
    RSS(ref_geom_cell_tuv_supported(ref_geom, new_nodes, REF_GEOM_FACE,
                                    &supported),
        "tuv support for swapped configuration");
    if (!supported) { /* abort collapse, cell tuv not supported */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    if (REF_SUCCESS !=
        ref_geom_tri_norm_deviation(ref_grid, new_nodes, &new_dev)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    /* allow if improvement */
    if ((new_dev < ref_grid_adapt(ref_grid, post_min_normdev)) &&
        (new_dev < orig_dev)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  /* skip uv checks for meshlink */
  if (ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      new_nodes[node] = nodes[node];
      if (node1 == new_nodes[node]) new_nodes[node] = node0;
    }
    new_nodes[ref_cell_node_per(ref_cell)] = nodes[ref_cell_node_per(ref_cell)];

    /* see if new config is below limit */
    RSS(ref_geom_cell_tuv_supported(ref_geom, nodes, REF_GEOM_FACE, &supported),
        "tuv support for original configuration");
    RAS(supported,
        "original configuration before collapse does not support cell tuv");
    RSS(ref_geom_cell_tuv_supported(ref_geom, new_nodes, REF_GEOM_FACE,
                                    &supported),
        "tuv support for swapped configuration");
    if (!supported) { /* abort collapse, cell tuv not supported */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    RSS(ref_geom_uv_area_sign(ref_grid, nodes[ref_cell_node_per(ref_cell)],
                              &sign_uv_area),
        "sign");
    RSS(ref_geom_uv_area(ref_geom, nodes, &orig_uv_area), "uv area");
    RSS(ref_geom_uv_area(ref_geom, new_nodes, &new_uv_area), "uv area");
    /* allow if improvement */
    if ((sign_uv_area * new_uv_area <= ref_node_min_uv_area(ref_node)) &&
        (sign_uv_area * new_uv_area < sign_uv_area * orig_uv_area)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}